

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.h
# Opt level: O2

void bov_text_set_space_type(bov_text_t *text,bov_space_type_t spaceType)

{
  GLfloat *pGVar1;
  
  if ((text->param).spaceType != PIXEL_SPACE) {
    pGVar1 = (text->param).pos;
    if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
      (text->param).pos[0] = 5.0;
    }
    pGVar1 = (text->param).pos + 1;
    if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
      (text->param).pos[1] = 5.0;
    }
    pGVar1 = &(text->param).fontSize;
    if (*pGVar1 <= 32.0 && *pGVar1 != 32.0) {
      (text->param).fontSize = 32.0;
    }
  }
  (text->param).spaceType = PIXEL_SPACE;
  return;
}

Assistant:

static inline void bov_text_set_space_type(bov_text_t* text,
                                           bov_space_type_t spaceType)
{
	if(spaceType==PIXEL_SPACE && text->param.spaceType!=PIXEL_SPACE) {
		if(text->param.pos[0] < 5.0f)
			text->param.pos[0] = 5.0f;
		if(text->param.pos[1] < 5.0f)
			text->param.pos[1] = 5.0f;
		if(text->param.fontSize < 32.0f)
			text->param.fontSize = 32.0f;
	}

	text->param.spaceType = spaceType;
}